

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O1

void __thiscall wallet::SQLiteBatch::SQLiteBatch(SQLiteBatch *this,SQLiteDatabase *database)

{
  long lVar1;
  SQliteExecHandler *pSVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (this->super_DatabaseBatch)._vptr_DatabaseBatch = (_func_int **)&PTR_ReadKey_006bd538;
  this->m_database = database;
  pSVar2 = (SQliteExecHandler *)operator_new(8);
  pSVar2->_vptr_SQliteExecHandler = (_func_int **)&PTR__SQliteExecHandler_006bd628;
  (this->m_exec_handler)._M_t.
  super___uniq_ptr_impl<wallet::SQliteExecHandler,_std::default_delete<wallet::SQliteExecHandler>_>.
  _M_t.
  super__Tuple_impl<0UL,_wallet::SQliteExecHandler_*,_std::default_delete<wallet::SQliteExecHandler>_>
  .super__Head_base<0UL,_wallet::SQliteExecHandler_*,_false>._M_head_impl = pSVar2;
  *(undefined8 *)((long)&this->m_delete_stmt + 1) = 0;
  *(undefined8 *)((long)&this->m_delete_prefix_stmt + 1) = 0;
  this->m_overwrite_stmt = (sqlite3_stmt *)0x0;
  this->m_delete_stmt = (sqlite3_stmt *)0x0;
  this->m_read_stmt = (sqlite3_stmt *)0x0;
  this->m_insert_stmt = (sqlite3_stmt *)0x0;
  if (database->m_db == (sqlite3 *)0x0) {
    __assert_fail("m_database.m_db",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/sqlite.cpp"
                  ,0x193,"wallet::SQLiteBatch::SQLiteBatch(SQLiteDatabase &)");
  }
  SetupSQLStatements(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SQLiteBatch::SQLiteBatch(SQLiteDatabase& database)
    : m_database(database)
{
    // Make sure we have a db handle
    assert(m_database.m_db);

    SetupSQLStatements();
}